

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O0

void slang::ast::ParameterBuilder::createDecls
               (Scope *scope,ParameterDeclarationBaseSyntax *syntax,bool isLocal,bool isPort,
               span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
               attributes,SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *results)

{
  bool bVar1;
  DeclaratorSyntax *args;
  TypeParameterDeclarationSyntax *args_1;
  SyntaxNode *in_RSI;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  TypeAssignmentSyntax *decl_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *__range3_1;
  TypeParameterDeclarationSyntax *paramSyntax_1;
  DeclaratorSyntax *decl;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range3;
  ParameterDeclarationSyntax *paramSyntax;
  iterator_base<const_slang::syntax::DeclaratorSyntax_*> *in_stack_ffffffffffffff58;
  self_type *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff80 [16];
  DeclaratorSyntax *in_stack_ffffffffffffff90;
  TypeAssignmentSyntax *args_2;
  ParameterDeclarationSyntax *in_stack_ffffffffffffff98;
  Scope *in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa8 [16];
  undefined1 in_stack_ffffffffffffffb8 [16];
  iterator_base<const_slang::syntax::DeclaratorSyntax_*> local_10;
  
  if (in_RSI->kind == ParameterDeclaration) {
    slang::syntax::SyntaxNode::as<slang::syntax::ParameterDeclarationSyntax>(in_RSI);
    cVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x497ef4);
    cVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x497f08);
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                             ((self_type *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      args = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0x497f33);
      in_stack_ffffffffffffff58 = &local_10;
      SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
      emplace_back<slang::ast::Scope_const&,slang::syntax::ParameterDeclarationSyntax_const&,slang::syntax::DeclaratorSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
                ((SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl> *)cVar3.list,
                 (Scope *)args,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff80._8_8_,in_stack_ffffffffffffff80._0_8_,
                 (span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)cVar2.index);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<const_slang::syntax::DeclaratorSyntax_*>,_false>
                  *)in_stack_ffffffffffffff60);
    }
  }
  else {
    args_1 = slang::syntax::SyntaxNode::as<slang::syntax::TypeParameterDeclarationSyntax>(in_RSI);
    args_2 = (TypeAssignmentSyntax *)&args_1->declarators;
    cVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *)0x497fae);
    slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::end
              ((SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax> *)0x497fc2);
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>_>
                             (in_stack_ffffffffffffff60,
                              (iterator_base<const_slang::syntax::TypeAssignmentSyntax_*> *)
                              in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>,_false>
      ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>,_false>
                   *)0x497fed);
      in_stack_ffffffffffffff58 = &local_10;
      SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>::
      emplace_back<slang::ast::Scope_const&,slang::syntax::TypeParameterDeclarationSyntax_const&,slang::syntax::TypeAssignmentSyntax_const&,bool&,bool&,std::span<slang::syntax::AttributeInstanceSyntax_const*const,18446744073709551615ul>&>
                (in_stack_ffffffffffffffa8._0_8_,in_stack_ffffffffffffffa0,args_1,args_2,
                 (bool *)cVar4.index,(bool *)cVar4.list,in_stack_ffffffffffffffb8._8_8_);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>,_false>
                  *)in_stack_ffffffffffffff60);
    }
  }
  return;
}

Assistant:

void ParameterBuilder::createDecls(const Scope& scope, const ParameterDeclarationBaseSyntax& syntax,
                                   bool isLocal, bool isPort,
                                   std::span<const AttributeInstanceSyntax* const> attributes,
                                   SmallVectorBase<Decl>& results) {
    if (syntax.kind == SyntaxKind::ParameterDeclaration) {
        auto& paramSyntax = syntax.as<ParameterDeclarationSyntax>();
        for (auto decl : paramSyntax.declarators)
            results.emplace_back(scope, paramSyntax, *decl, isLocal, isPort, attributes);
    }
    else {
        auto& paramSyntax = syntax.as<TypeParameterDeclarationSyntax>();
        for (auto decl : paramSyntax.declarators)
            results.emplace_back(scope, paramSyntax, *decl, isLocal, isPort, attributes);
    }
}